

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::IntlEngineInterfaceExtensionObject::cleanUpIntl
          (IntlEngineInterfaceExtensionObject *this,ScriptContext *scriptContext,
          DynamicObject *intlObject)

{
  BOOL BVar1;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  DynamicObject *local_20;
  DynamicObject *intlObject_local;
  ScriptContext *scriptContext_local;
  IntlEngineInterfaceExtensionObject *this_local;
  
  local_28 = (nullptr_t)0x0;
  local_20 = intlObject;
  intlObject_local = (DynamicObject *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(&this->dateToLocaleString,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
            (&this->dateToLocaleTimeString,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
            (&this->dateToLocaleDateString,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(&this->numberToLocaleString,&local_40);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(&this->stringLocaleCompare,&local_48);
  BVar1 = Js::JavascriptOperators::HasProperty(&local_20->super_RecyclableObject,0x24b);
  if (BVar1 != 0) {
    (*(local_20->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x21])(local_20,0x24b,0);
  }
  BVar1 = Js::JavascriptOperators::HasProperty(&local_20->super_RecyclableObject,0x232);
  if (BVar1 != 0) {
    (*(local_20->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x21])(local_20,0x232,0);
  }
  BVar1 = Js::JavascriptOperators::HasProperty(&local_20->super_RecyclableObject,0x256);
  if (BVar1 != 0) {
    (*(local_20->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x21])(local_20,0x256,0);
  }
  return;
}

Assistant:

void IntlEngineInterfaceExtensionObject::cleanUpIntl(ScriptContext *scriptContext, DynamicObject* intlObject)
    {
        this->dateToLocaleString = nullptr;
        this->dateToLocaleTimeString = nullptr;
        this->dateToLocaleDateString = nullptr;
        this->numberToLocaleString = nullptr;
        this->stringLocaleCompare = nullptr;

        //Failed to setup Intl; Windows.Globalization.dll is most likely missing.
        if (Js::JavascriptOperators::HasProperty(intlObject, Js::PropertyIds::Collator))
        {
            intlObject->DeleteProperty(Js::PropertyIds::Collator, Js::PropertyOperationFlags::PropertyOperation_None);
        }
        if (Js::JavascriptOperators::HasProperty(intlObject, Js::PropertyIds::NumberFormat))
        {
            intlObject->DeleteProperty(Js::PropertyIds::NumberFormat, Js::PropertyOperationFlags::PropertyOperation_None);
        }
        if (Js::JavascriptOperators::HasProperty(intlObject, Js::PropertyIds::DateTimeFormat))
        {
            intlObject->DeleteProperty(Js::PropertyIds::DateTimeFormat, Js::PropertyOperationFlags::PropertyOperation_None);
        }
    }